

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::setMinimumPDFVersion(QPDFWriter *this,string *version,int extension_level)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  QPDFWriter *this_00;
  int min_minor;
  int old_minor;
  int min_major;
  int old_major;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if ((((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      min_pdf_version)._M_string_length == 0) {
    bVar1 = true;
    bVar2 = true;
  }
  else {
    local_34 = 0;
    local_3c = 0;
    local_38 = 0;
    local_40 = 0;
    this_00 = this;
    parseVersion(this,version,&local_34,&local_3c);
    parseVersion(this_00,&((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->min_pdf_version,&local_38,&local_40);
    uVar3 = 0xffffffff;
    if ((local_38 <= local_34) && (uVar3 = 1, local_34 <= local_38)) {
      uVar3 = 0xffffffff;
      if (local_40 <= local_3c) {
        uVar3 = (uint)(local_40 < local_3c);
      }
    }
    bVar1 = true;
    bVar2 = 0 < (int)uVar3;
    if ((int)uVar3 < 1) {
      if (uVar3 == 0) {
        bVar1 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->min_extension_level < extension_level;
      }
      else {
        bVar1 = false;
      }
    }
  }
  if (bVar2) {
    std::__cxx11::string::_M_assign
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->min_pdf_version);
  }
  if (bVar1) {
    ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    min_extension_level = extension_level;
  }
  return;
}

Assistant:

void
QPDFWriter::setMinimumPDFVersion(std::string const& version, int extension_level)
{
    bool set_version = false;
    bool set_extension_level = false;
    if (m->min_pdf_version.empty()) {
        set_version = true;
        set_extension_level = true;
    } else {
        int old_major = 0;
        int old_minor = 0;
        int min_major = 0;
        int min_minor = 0;
        parseVersion(version, old_major, old_minor);
        parseVersion(m->min_pdf_version, min_major, min_minor);
        int compare = compareVersions(old_major, old_minor, min_major, min_minor);
        if (compare > 0) {
            QTC::TC("qpdf", "QPDFWriter increasing minimum version", extension_level == 0 ? 0 : 1);
            set_version = true;
            set_extension_level = true;
        } else if (compare == 0) {
            if (extension_level > m->min_extension_level) {
                QTC::TC("qpdf", "QPDFWriter increasing extension level");
                set_extension_level = true;
            }
        }
    }

    if (set_version) {
        m->min_pdf_version = version;
    }
    if (set_extension_level) {
        m->min_extension_level = extension_level;
    }
}